

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo_emulator.c
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  int ii;
  char **argv_local;
  int argc_local;
  
  printf("Command:");
  for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
    printf(" \"%s\"",argv[local_1c]);
  }
  printf("\n");
  return 0x2a;
}

Assistant:

int main(int argc, char * argv[] )
{
 int ii;

 printf("Command:");
 for(ii = 1; ii < argc; ++ii)
 {
 printf(" \"%s\"", argv[ii]);
 }
 printf("\n");

 return 42;
}